

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

bool __thiscall hwnet::TCPSocket::IsClosed(TCPSocket *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  TCPSocket *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mtx);
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->closed);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return bVar1;
}

Assistant:

bool IsClosed() {
		std::lock_guard<std::mutex> guard(this->mtx);
		return this->closed;
	}